

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clock.cpp
# Opt level: O0

void showClock(void)

{
  RGB *pRVar1;
  RGB local_33;
  ulong local_30;
  size_t hourDividerIndex;
  int local_20;
  int hour;
  int min;
  int sec;
  tm *l_t;
  time_t t;
  
  WS2812B::Led::clear(&leds);
  l_t = (tm *)time((time_t *)0x0);
  _min = localtime((time_t *)&l_t);
  hour = _min->tm_sec;
  local_20 = _min->tm_min;
  hourDividerIndex._4_4_ = _min->tm_hour;
  for (local_30 = 0; local_30 < 0xd; local_30 = local_30 + 1) {
    WS2812B::RGB::RGB(&local_33,'\x0f','\x0f','\x0f');
    WS2812B::Led::setColor(&leds,&local_33,(int)(local_30 << 1));
  }
  pRVar1 = WS2812B::Led::getColor(&leds,hour);
  WS2812B::RGB::setB(pRVar1,'\x7f');
  pRVar1 = WS2812B::Led::getColor(&leds,local_20);
  WS2812B::RGB::setG(pRVar1,'\x7f');
  pRVar1 = WS2812B::Led::getColor(&leds,(hourDividerIndex._4_4_ % 0xc) * 2 + local_20 / 0xf);
  WS2812B::RGB::setR(pRVar1,'\x7f');
  WS2812B::Led::show(&leds);
  sleep(1);
  return;
}

Assistant:

void showClock() {

    leds.clear();
    time_t t = ::time(nullptr);
    tm *l_t = ::localtime(&t);

    int sec = l_t->tm_sec;
    int min = l_t->tm_min;
    int hour = l_t->tm_hour;

    for (size_t hourDividerIndex = 0; hourDividerIndex <= 12; hourDividerIndex++) {
        leds.setColor(WS2812B::RGB(LOW_WHITE), hourDividerIndex * (NUM_LEDS / 12));
    }

    leds.getColor(sec).setB(HIGH_LIGHT0);
    leds.getColor(min).setG(HIGH_LIGHT0);
    leds.getColor((NUM_LEDS / 12) * (hour % 12) + (min / 15)).setR(HIGH_LIGHT0);
    leds.show();
    sleep(1);
}